

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerouteRunner.cpp
# Opt level: O1

void __thiscall TracerouteRunner::TracerouteRunner(TracerouteRunner *this,string *net_addr)

{
  (this->mutex_results).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mutex_results).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mutex_results).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_results).super___mutex_base._M_mutex + 0x10) = 0;
  (this->results).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mutex_results).super___mutex_base._M_mutex.__align = 0;
  (this->results).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->results).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->network_address)._M_dataplus._M_p = (pointer)&(this->network_address).field_2;
  (this->network_address)._M_string_length = 0;
  (this->network_address).field_2._M_local_buf[0] = '\0';
  this->output_position = 0;
  this->read_complete = false;
  std::__cxx11::string::_M_assign((string *)&this->network_address);
  return;
}

Assistant:

TracerouteRunner::TracerouteRunner(const std::string &net_addr) {
	this->network_address = net_addr;
}